

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_AllLite1_Test<absl::lts_20250127::Cord>::TestBody
          (LiteTest_AllLite1_Test<absl::lts_20250127::Cord> *this)

{
  TypeParam data;
  TestAllTypesLite message;
  TestAllTypesLite message2;
  TestAllTypesLite message3;
  MessageLite local_9f0;
  TestAllTypesLite local_9e0;
  TestAllTypesLite local_698;
  TestAllTypesLite local_350;
  
  proto2_unittest::TestAllTypesLite::TestAllTypesLite(&local_9e0,(Arena *)0x0);
  proto2_unittest::TestAllTypesLite::TestAllTypesLite(&local_698,(Arena *)0x0);
  proto2_unittest::TestAllTypesLite::TestAllTypesLite(&local_350,(Arena *)0x0);
  TestUtilLite::ExpectClear(&local_9e0);
  TestUtilLite::SetAllFields(&local_9e0);
  proto2_unittest::TestAllTypesLite::CopyFrom(&local_698,&local_9e0);
  MessageLite::SerializeAsCord(&local_9f0);
  MessageLite::ParseFromString(&local_350.super_MessageLite,(Cord *)&local_9f0);
  TestUtilLite::ExpectAllFieldsSet(&local_9e0);
  TestUtilLite::ExpectAllFieldsSet(&local_698);
  TestUtilLite::ExpectAllFieldsSet(&local_350);
  TestUtilLite::ModifyRepeatedFields(&local_9e0);
  TestUtilLite::ExpectRepeatedFieldsModified(&local_9e0);
  proto2_unittest::TestAllTypesLite::Clear(&local_9e0);
  TestUtilLite::ExpectClear(&local_9e0);
  absl::lts_20250127::Cord::~Cord((Cord *)&local_9f0);
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite(&local_350);
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite(&local_698);
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite(&local_9e0);
  return;
}

Assistant:

TYPED_TEST(LiteTest, AllLite1) {
  {
    proto2_unittest::TestAllTypesLite message, message2, message3;
    TestUtilLite::ExpectClear(message);
    TestUtilLite::SetAllFields(&message);
    message2 = message;
    TypeParam data = SerializeAs<TypeParam>(message2);
    ParseFrom(data, message3);
    TestUtilLite::ExpectAllFieldsSet(message);
    TestUtilLite::ExpectAllFieldsSet(message2);
    TestUtilLite::ExpectAllFieldsSet(message3);
    TestUtilLite::ModifyRepeatedFields(&message);
    TestUtilLite::ExpectRepeatedFieldsModified(message);
    message.Clear();
    TestUtilLite::ExpectClear(message);
  }
}